

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeleLM.cpp
# Opt level: O0

void __thiscall
PeleLM::advance_chemistry(PeleLM *this,MultiFab *mf_old,MultiFab *mf_new,Real dt,MultiFab *Force)

{
  undefined4 uVar1;
  undefined4 uVar2;
  FabFactory<amrex::FArrayBox> *pFVar3;
  bool bVar4;
  int iVar5;
  PeleLM *this_00;
  int *piVar6;
  Long LVar7;
  FabArrayBase *pFVar8;
  pointer pRVar9;
  FabArrayBase *in_RCX;
  FabArrayBase *in_RDX;
  FabArrayBase *in_RSI;
  long in_RDI;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM0_Db;
  Periodicity PVar10;
  Real mn;
  Real mx;
  int IOProc;
  MultiFab *fine_React;
  MultiFab *FC;
  Real dt_inv;
  Array4<double> *rhoYdot;
  Array4<const_double> *frc_rhoY_1;
  Array4<const_double> *rhoY_n;
  Array4<const_double> *rhoY_o;
  Box *bx_1;
  MFIter mfi;
  Real time_chem;
  Real dt_incr;
  Array4<int> *mask;
  Array4<double> *frc_rhoH;
  Array4<double> *frc_rhoY;
  Array4<double> *fcl;
  Array4<double> *temp;
  Array4<double> *rhoH;
  Array4<double> *rhoY;
  Box *bx;
  MFIter Smfi;
  bool do_diag;
  FabArray<amrex::BaseFab<int>_> react_mask;
  MultiFab diagTemp;
  MultiFab fcnCntTemp;
  MultiFab FTemp;
  MultiFab STemp;
  int j;
  IntVect chunk;
  IntVect ChunkSize;
  int cnt;
  bool done;
  int Threshold;
  DistributionMapping dm;
  BoxArray ba;
  int ngrow;
  MultiFab *React_new;
  BoxArray cf_grids;
  bool do_avg_down_chem;
  Real strt_time;
  BoxArray *in_stack_ffffffffffffe788;
  char (*x) [51];
  ulong uVar11;
  int iVar12;
  PeleLM *in_stack_ffffffffffffe790;
  FabArray<amrex::BaseFab<int>_> *in_stack_ffffffffffffe798;
  MultiFab *S_fine;
  undefined1 cross;
  NavierStokesBase *in_stack_ffffffffffffe7a0;
  undefined8 *in_stack_ffffffffffffe7a8;
  int in_stack_ffffffffffffe7b0;
  int in_stack_ffffffffffffe7b4;
  FabArray<amrex::BaseFab<int>_> *in_stack_ffffffffffffe7b8;
  Print *in_stack_ffffffffffffe7c0;
  BoxArray *in_stack_ffffffffffffe7c8;
  FabArray<amrex::BaseFab<int>_> *in_stack_ffffffffffffe7d0;
  anon_class_256_4_7cbd0fce *in_stack_ffffffffffffe7d8;
  Box *in_stack_ffffffffffffe7e0;
  undefined8 in_stack_ffffffffffffe7e8;
  FabArray<amrex::FArrayBox> *in_stack_ffffffffffffe7f0;
  FabArray<amrex::FArrayBox> *in_stack_ffffffffffffe7f8;
  undefined4 in_stack_ffffffffffffe800;
  undefined4 in_stack_ffffffffffffe804;
  undefined8 in_stack_ffffffffffffe810;
  undefined4 in_stack_ffffffffffffe818;
  int iVar13;
  CpOp op;
  IntVect *in_stack_ffffffffffffe850;
  BoxArray *in_stack_ffffffffffffe858;
  BoxArray *in_stack_ffffffffffffe8b0;
  undefined4 in_stack_ffffffffffffe8b8;
  undefined4 in_stack_ffffffffffffe8bc;
  bool local_1699;
  bool local_15c1;
  int in_stack_ffffffffffffea8c;
  BoxArray *in_stack_ffffffffffffea90;
  PeleLM *in_stack_ffffffffffffea98;
  int in_stack_ffffffffffffeb0c;
  int in_stack_ffffffffffffeb10;
  int in_stack_ffffffffffffeb14;
  Geometry *in_stack_ffffffffffffeb18;
  MultiFab *in_stack_ffffffffffffeb20;
  double local_1438;
  double local_1430;
  int local_1424;
  IntVect local_1420;
  undefined8 local_1410;
  int local_1408;
  MultiFab *local_1400;
  int local_13f4;
  FabArrayBase *local_13f0;
  allocator local_13e1;
  string local_13e0 [32];
  undefined1 local_13c0 [64];
  undefined1 auStack_1380 [64];
  undefined1 auStack_1340 [64];
  undefined1 auStack_1300 [64];
  double local_12c0;
  double local_12b8;
  undefined1 local_12b0 [64];
  undefined1 *local_1270;
  undefined1 local_1268 [64];
  undefined1 *local_1228;
  undefined1 local_1220 [64];
  undefined1 *local_11e0;
  undefined1 local_11d8 [64];
  undefined1 *local_1198;
  undefined1 local_118c [28];
  undefined1 *local_1170;
  MFIter local_1168;
  undefined1 local_1108 [64];
  undefined1 auStack_10c8 [64];
  undefined8 local_1088;
  undefined1 local_1080 [104];
  Real RStack_1018;
  undefined4 uStack_1010;
  undefined4 local_100c;
  undefined4 uStack_1008;
  undefined8 uStack_1004;
  _func_int **local_ff8;
  Real RStack_ff0;
  _func_int **local_fe8;
  double dStack_fe0;
  _func_int **pp_Stack_fd8;
  float fStack_fd0;
  float local_fcc;
  float fStack_fc8;
  int aiStack_fc4 [3];
  pointer local_fb8;
  pointer piStack_fb0;
  pointer local_fa8;
  undefined8 uStack_fa0;
  undefined8 uStack_f98;
  undefined4 uStack_f90;
  undefined4 local_f8c;
  undefined4 uStack_f88;
  undefined8 uStack_f84;
  undefined1 local_f78 [208];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_ea8;
  undefined1 local_ea0 [216];
  undefined8 local_dc8 [9];
  undefined1 local_d7c [539];
  allocator local_b61;
  string local_b60 [32];
  char local_b40 [55];
  allocator local_b09;
  string local_b08 [36];
  byte local_ae4;
  byte local_ae3;
  byte local_ae2;
  allocator local_ae1;
  string local_ae0 [143];
  byte local_a51;
  pointer local_a50;
  _Bit_type *local_a48;
  undefined8 uStack_a40;
  _Bit_type *local_a38;
  undefined8 uStack_a30;
  _Bit_pointer local_a28;
  undefined8 local_720;
  undefined8 local_718;
  undefined8 uStack_710;
  undefined8 local_708;
  undefined8 uStack_700;
  undefined8 local_6f8;
  pointer local_570;
  pointer local_568;
  ShMem SStack_560;
  __uniq_ptr_impl<amrex::FBData<amrex::BaseFab<int>_>,_std::default_delete<amrex::FBData<amrex::BaseFab<int>_>_>_>
  local_548;
  pointer local_3c0;
  pointer local_3b8;
  void *pvStack_3b0;
  MultiArray4<int> local_3a8;
  MultiArray4<const_int> MStack_3a0;
  pointer local_398;
  int local_200;
  FabFactory<amrex::FArrayBox> *local_1fc;
  int local_1f4;
  unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
  local_1f0;
  int local_1e8;
  undefined8 local_1e0;
  int local_1d8;
  int local_1d4;
  byte local_1cd;
  int local_1cc;
  int local_150;
  int local_14c;
  int local_148;
  int local_144 [37];
  FabArrayBase *local_b0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a8;
  FabArrayBase *local_a0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_98;
  int local_84;
  FabFactory<amrex::FArrayBox> **local_80;
  undefined4 local_74;
  __uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
  local_70;
  undefined4 local_64;
  undefined8 *local_60;
  undefined4 local_54;
  pointer local_50;
  _Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
  local_48;
  int local_40;
  int local_34;
  RefID local_30;
  _Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false> local_24;
  int local_1c;
  
  local_a8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(in_XMM0_Db,in_XMM0_Da);
  local_b0 = in_RCX;
  local_a0 = in_RDX;
  local_98._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)in_RSI;
  local_144._140_8_ = amrex::ParallelDescriptor::second();
  local_15c1 = false;
  if ((avg_down_chem & 1U) != 0) {
    iVar12 = *(int *)(in_RDI + 8);
    iVar5 = amrex::AmrMesh::finestLevel(*(AmrMesh **)(in_RDI + 0x150));
    local_15c1 = false;
    if (iVar12 < iVar5) {
      getLevel(in_stack_ffffffffffffe790,(int)((ulong)in_stack_ffffffffffffe788 >> 0x20));
      amrex::Vector<amrex::StateData,_std::allocator<amrex::StateData>_>::operator[]
                ((Vector<amrex::StateData,_std::allocator<amrex::StateData>_> *)
                 in_stack_ffffffffffffe790,(size_type)in_stack_ffffffffffffe788);
      local_15c1 = amrex::StateData::hasOldData((StateData *)0x29a6ca);
    }
  }
  local_144[0x22]._3_1_ = local_15c1;
  if (hack_nochem == 0) {
    amrex::BoxArray::BoxArray((BoxArray *)in_stack_ffffffffffffe790);
    if ((local_144[0x22]._3_1_ & 1) != 0) {
      this_00 = getLevel(in_stack_ffffffffffffe790,(int)((ulong)in_stack_ffffffffffffe788 >> 0x20));
      amrex::AmrLevel::boxArray((AmrLevel *)this_00);
      amrex::BoxArray::operator=((BoxArray *)in_stack_ffffffffffffe790,in_stack_ffffffffffffe788);
      amrex::BoxArray::coarsen
                ((BoxArray *)in_stack_ffffffffffffe7d8,(IntVect *)in_stack_ffffffffffffe7d0);
    }
    local_144._4_8_ =
         amrex::AmrLevel::get_new_data
                   ((AmrLevel *)in_stack_ffffffffffffe790,
                    (int)((ulong)in_stack_ffffffffffffe788 >> 0x20));
    local_148 = amrex::FabArrayBase::nGrow((FabArrayBase *)local_144._4_8_,0);
    local_14c = amrex::FabArrayBase::nGrow((FabArrayBase *)local_98._M_pi,0);
    piVar6 = std::min<int>(&local_148,&local_14c);
    local_150 = amrex::FabArrayBase::nGrow(local_a0,0);
    piVar6 = std::min<int>(piVar6,&local_150);
    local_144[0] = *piVar6;
    amrex::FabArrayBase::boxArray(local_a0);
    amrex::BoxArray::BoxArray((BoxArray *)in_stack_ffffffffffffe790,in_stack_ffffffffffffe788);
    amrex::FabArrayBase::DistributionMap(local_a0);
    amrex::DistributionMapping::DistributionMapping
              ((DistributionMapping *)in_stack_ffffffffffffe790,
               (DistributionMapping *)in_stack_ffffffffffffe788);
    iVar12 = (anonymous_namespace)::chem_box_chop_threshold;
    local_1cc = amrex::ParallelDescriptor::NProcs();
    local_1cc = iVar12 * local_1cc;
    LVar7 = amrex::BoxArray::size((BoxArray *)0x29a940);
    local_1cd = local_1cc <= LVar7;
    local_1d4 = 1;
    while (((local_1cd ^ 0xff) & 1) != 0) {
      local_30.data =
           (BARef *)amrex::AmrMesh::maxGridSize
                              ((AmrMesh *)in_stack_ffffffffffffe790,
                               (int)((ulong)in_stack_ffffffffffffe788 >> 0x20));
      local_34 = local_1d4;
      amrex::IntVect::IntVect
                ((IntVect *)&local_24,
                 *(int *)&((local_30.data)->m_abox).
                          super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                          super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                          super__Vector_impl_data / local_1d4,
                 *(int *)((long)&((local_30.data)->m_abox).
                                 super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                 super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl
                                 .super__Vector_impl_data._M_start + 4) / local_1d4,
                 *(int *)&((local_30.data)->m_abox).
                          super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                          super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                          super__Vector_impl_data._M_finish / local_1d4);
      local_40 = local_1c;
      local_48.super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl =
           (_Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>)
           (_Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>)local_24._M_head_impl;
      local_1e8 = local_1c;
      local_1f0._M_t.
      super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
      .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl =
           (__uniq_ptr_data<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>,_true,_true>
            )(__uniq_ptr_data<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>,_true,_true>
              )local_24._M_head_impl;
      local_1e0 = local_24._M_head_impl;
      pFVar3 = local_1e0;
      local_1d8 = local_1c;
      local_50 = (pointer)&local_1e0;
      local_54 = 0;
      local_1e0._0_4_ = (uint)local_24._M_head_impl;
      bVar4 = (int)(uint)local_1e0 < 0x10;
      local_1e0 = pFVar3;
      if (bVar4) break;
      local_60 = &local_1e0;
      local_64 = 1;
      local_1e0._4_4_ = (int)((ulong)local_24._M_head_impl >> 0x20);
      bVar4 = local_1e0._4_4_ < 0x10;
      if (bVar4) break;
      local_70._M_t.
      super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
      .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl =
           (tuple<amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
            )&local_1e0;
      local_74._0_1_ = true;
      local_74._1_3_ = 0;
      if (local_1c < 0x10) break;
      local_1fc = local_24._M_head_impl;
      local_1f4 = local_1c;
      local_200 = 2;
      while( true ) {
        bVar4 = false;
        if (-1 < local_200) {
          LVar7 = amrex::BoxArray::size((BoxArray *)0x29ab3e);
          bVar4 = LVar7 < local_1cc;
        }
        if (!bVar4) break;
        local_80 = &local_1fc;
        local_84 = local_200;
        *(int *)((long)local_80 + (long)local_200 * 4) =
             *(int *)((long)local_80 + (long)local_200 * 4) / 2;
        amrex::BoxArray::maxSize(in_stack_ffffffffffffe858,in_stack_ffffffffffffe850);
        LVar7 = amrex::BoxArray::size((BoxArray *)0x29abbc);
        if (local_1cc <= LVar7) {
          local_1cd = 1;
        }
        local_200 = local_200 + -1;
      }
      local_1d4 = local_1d4 << 1;
    }
    getFuncCountDM(in_stack_ffffffffffffea98,in_stack_ffffffffffffea90,in_stack_ffffffffffffea8c);
    amrex::DistributionMapping::operator=
              ((DistributionMapping *)in_stack_ffffffffffffe790,
               (DistributionMapping *)in_stack_ffffffffffffe788);
    amrex::DistributionMapping::~DistributionMapping((DistributionMapping *)0x29ac73);
    local_3a8.hp = (Array4<int> *)0x0;
    MStack_3a0.hp = (Array4<const_int> *)0x0;
    local_3b8 = (pointer)0x0;
    pvStack_3b0 = (void *)0x0;
    local_398 = (pointer)0x0;
    amrex::MFInfo::MFInfo((MFInfo *)0x29aca7);
    local_3c0 = (pointer)0x0;
    amrex::DefaultFabFactory<amrex::FArrayBox>::DefaultFabFactory
              ((DefaultFabFactory<amrex::FArrayBox> *)in_stack_ffffffffffffe790);
    amrex::MultiFab::MultiFab
              ((MultiFab *)in_stack_ffffffffffffe7d0,in_stack_ffffffffffffe7c8,
               (DistributionMapping *)in_stack_ffffffffffffe7c0,
               (int)((ulong)in_stack_ffffffffffffe7b8 >> 0x20),(int)in_stack_ffffffffffffe7b8,
               (MFInfo *)CONCAT44(in_stack_ffffffffffffe7b4,in_stack_ffffffffffffe7b0),
               (FabFactory<amrex::FArrayBox> *)in_stack_ffffffffffffe7e0);
    amrex::DefaultFabFactory<amrex::FArrayBox>::~DefaultFabFactory
              ((DefaultFabFactory<amrex::FArrayBox> *)0x29ad12);
    amrex::MFInfo::~MFInfo((MFInfo *)0x29ad1f);
    amrex::FabArrayBase::nComp(local_b0);
    SStack_560.n_values = 0;
    SStack_560.n_points = 0;
    local_568 = (pointer)0x0;
    SStack_560.alloc = false;
    SStack_560._1_7_ = 0;
    local_548._M_t.
    super__Tuple_impl<0UL,_amrex::FBData<amrex::BaseFab<int>_>_*,_std::default_delete<amrex::FBData<amrex::BaseFab<int>_>_>_>
    .super__Head_base<0UL,_amrex::FBData<amrex::BaseFab<int>_>_*,_false>._M_head_impl =
         (tuple<amrex::FBData<amrex::BaseFab<int>_>_*,_std::default_delete<amrex::FBData<amrex::BaseFab<int>_>_>_>
          )(_Tuple_impl<0UL,_amrex::FBData<amrex::BaseFab<int>_>_*,_std::default_delete<amrex::FBData<amrex::BaseFab<int>_>_>_>
            )0x0;
    amrex::MFInfo::MFInfo((MFInfo *)0x29ad67);
    local_570 = (pointer)0x0;
    amrex::DefaultFabFactory<amrex::FArrayBox>::DefaultFabFactory
              ((DefaultFabFactory<amrex::FArrayBox> *)in_stack_ffffffffffffe790);
    amrex::MultiFab::MultiFab
              ((MultiFab *)in_stack_ffffffffffffe7d0,in_stack_ffffffffffffe7c8,
               (DistributionMapping *)in_stack_ffffffffffffe7c0,
               (int)((ulong)in_stack_ffffffffffffe7b8 >> 0x20),(int)in_stack_ffffffffffffe7b8,
               (MFInfo *)CONCAT44(in_stack_ffffffffffffe7b4,in_stack_ffffffffffffe7b0),
               (FabFactory<amrex::FArrayBox> *)in_stack_ffffffffffffe7e0);
    amrex::DefaultFabFactory<amrex::FArrayBox>::~DefaultFabFactory
              ((DefaultFabFactory<amrex::FArrayBox> *)0x29add4);
    amrex::MFInfo::~MFInfo((MFInfo *)0x29ade1);
    amrex::Periodicity::NonPeriodic();
    amrex::FabArray<amrex::FArrayBox>::ParallelCopy
              ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffe7c0,
               (FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffe7b8,in_stack_ffffffffffffe7b4,
               in_stack_ffffffffffffe7b0,(int)((ulong)in_stack_ffffffffffffe7a8 >> 0x20),
               (Periodicity *)in_stack_ffffffffffffe7a0,(CpOp)in_stack_ffffffffffffe7d0);
    amrex::Periodicity::NonPeriodic();
    amrex::FabArray<amrex::FArrayBox>::ParallelCopy
              ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffe7c0,
               (FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffe7b8,
               (Periodicity *)CONCAT44(in_stack_ffffffffffffe7b4,in_stack_ffffffffffffe7b0),
               (CpOp)((ulong)in_stack_ffffffffffffe7a8 >> 0x20));
    local_708 = 0;
    uStack_700 = 0;
    local_718 = 0;
    uStack_710 = 0;
    local_6f8 = 0;
    amrex::MFInfo::MFInfo((MFInfo *)0x29ae9a);
    local_720 = 0;
    amrex::DefaultFabFactory<amrex::FArrayBox>::DefaultFabFactory
              ((DefaultFabFactory<amrex::FArrayBox> *)in_stack_ffffffffffffe790);
    amrex::MultiFab::MultiFab
              ((MultiFab *)in_stack_ffffffffffffe7d0,in_stack_ffffffffffffe7c8,
               (DistributionMapping *)in_stack_ffffffffffffe7c0,
               (int)((ulong)in_stack_ffffffffffffe7b8 >> 0x20),(int)in_stack_ffffffffffffe7b8,
               (MFInfo *)CONCAT44(in_stack_ffffffffffffe7b4,in_stack_ffffffffffffe7b0),
               (FabFactory<amrex::FArrayBox> *)in_stack_ffffffffffffe7e0);
    amrex::DefaultFabFactory<amrex::FArrayBox>::~DefaultFabFactory
              ((DefaultFabFactory<amrex::FArrayBox> *)0x29af05);
    amrex::MFInfo::~MFInfo((MFInfo *)0x29af12);
    amrex::MultiFab::MultiFab((MultiFab *)in_stack_ffffffffffffe790);
    amrex::FabArray<amrex::BaseFab<int>_>::FabArray
              ((FabArray<amrex::BaseFab<int>_> *)in_stack_ffffffffffffe790);
    local_a38 = (_Bit_type *)0x0;
    uStack_a30._0_4_ = 0;
    uStack_a30._4_4_ = 0;
    local_a48 = (_Bit_type *)0x0;
    uStack_a40._0_4_ = 0;
    uStack_a40._4_4_ = 0;
    local_a28 = (_Bit_pointer)0x0;
    amrex::MFInfo::MFInfo((MFInfo *)0x29af68);
    local_a50 = (pointer)0x0;
    x = (char (*) [51])&local_a50;
    amrex::DefaultFabFactory<amrex::BaseFab<int>_>::DefaultFabFactory
              ((DefaultFabFactory<amrex::BaseFab<int>_> *)in_stack_ffffffffffffe790);
    amrex::FabArray<amrex::BaseFab<int>_>::define
              (in_stack_ffffffffffffe7d0,in_stack_ffffffffffffe7c8,
               (DistributionMapping *)in_stack_ffffffffffffe7c0,
               (int)((ulong)in_stack_ffffffffffffe7b8 >> 0x20),(int)in_stack_ffffffffffffe7b8,
               (MFInfo *)CONCAT44(in_stack_ffffffffffffe7b4,in_stack_ffffffffffffe7b0),
               (FabFactory<amrex::BaseFab<int>_> *)in_stack_ffffffffffffe7e0);
    amrex::DefaultFabFactory<amrex::BaseFab<int>_>::~DefaultFabFactory
              ((DefaultFabFactory<amrex::BaseFab<int>_> *)0x29afd3);
    amrex::MFInfo::~MFInfo((MFInfo *)0x29afe0);
    amrex::Periodicity::NonPeriodic();
    amrex::FabArray<amrex::BaseFab<int>_>::ParallelCopy
              ((FabArray<amrex::BaseFab<int>_> *)in_stack_ffffffffffffe7c0,in_stack_ffffffffffffe7b8
               ,(Periodicity *)CONCAT44(in_stack_ffffffffffffe7b4,in_stack_ffffffffffffe7b0),
               (CpOp)((ulong)in_stack_ffffffffffffe7a8 >> 0x20));
    local_ae2 = 0;
    local_ae3 = 0;
    local_ae4 = 0;
    local_1699 = false;
    if ((plot_reactions & 1U) != 0) {
      std::allocator<char>::allocator();
      local_ae2 = 1;
      std::__cxx11::string::string(local_ae0,"REACTIONS",&local_ae1);
      local_ae3 = 1;
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>
      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>
                    *)in_stack_ffffffffffffe7d0,(key_type *)in_stack_ffffffffffffe7c8);
      pFVar8 = (FabArrayBase *)
               std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::operator->
                         ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
                          0x29b0cc);
      amrex::FabArrayBase::boxArray(pFVar8);
      amrex::intersect((BoxArray *)CONCAT44(in_stack_ffffffffffffe8bc,in_stack_ffffffffffffe8b8),
                       in_stack_ffffffffffffe8b0);
      local_ae4 = 1;
      LVar7 = amrex::BoxArray::size((BoxArray *)0x29b103);
      local_1699 = LVar7 != 0;
    }
    if ((local_ae4 & 1) != 0) {
      amrex::BoxArray::~BoxArray((BoxArray *)in_stack_ffffffffffffe790);
    }
    if ((local_ae3 & 1) != 0) {
      std::__cxx11::string::~string(local_ae0);
    }
    if ((local_ae2 & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)&local_ae1);
    }
    local_a51 = local_1699;
    if (local_1699 != false) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_b08,"REACTIONS",&local_b09);
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>
      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>
                    *)in_stack_ffffffffffffe7d0,(key_type *)in_stack_ffffffffffffe7c8);
      pFVar8 = (FabArrayBase *)
               std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::operator->
                         ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
                          0x29b1fd);
      amrex::FabArrayBase::nComp(pFVar8);
      local_b40[0x18] = '\0';
      local_b40[0x19] = '\0';
      local_b40[0x1a] = '\0';
      local_b40[0x1b] = '\0';
      local_b40[0x1c] = '\0';
      local_b40[0x1d] = '\0';
      local_b40[0x1e] = '\0';
      local_b40[0x1f] = '\0';
      local_b40[0x20] = '\0';
      local_b40[0x21] = '\0';
      local_b40[0x22] = '\0';
      local_b40[0x23] = '\0';
      local_b40[0x24] = '\0';
      local_b40[0x25] = '\0';
      local_b40[0x26] = '\0';
      local_b40[0x27] = '\0';
      local_b40[8] = '\0';
      local_b40[9] = '\0';
      local_b40[10] = '\0';
      local_b40[0xb] = '\0';
      local_b40[0xc] = '\0';
      local_b40[0xd] = '\0';
      local_b40[0xe] = '\0';
      local_b40[0xf] = '\0';
      local_b40[0x10] = '\0';
      local_b40[0x11] = '\0';
      local_b40[0x12] = '\0';
      local_b40[0x13] = '\0';
      local_b40[0x14] = '\0';
      local_b40[0x15] = '\0';
      local_b40[0x16] = '\0';
      local_b40[0x17] = '\0';
      local_b40[0x28] = '\0';
      local_b40[0x29] = '\0';
      local_b40[0x2a] = '\0';
      local_b40[0x2b] = '\0';
      local_b40[0x2c] = '\0';
      local_b40[0x2d] = '\0';
      local_b40[0x2e] = '\0';
      local_b40[0x2f] = '\0';
      amrex::MFInfo::MFInfo((MFInfo *)0x29b240);
      local_b40[0] = '\0';
      local_b40[1] = '\0';
      local_b40[2] = '\0';
      local_b40[3] = '\0';
      local_b40[4] = '\0';
      local_b40[5] = '\0';
      local_b40[6] = '\0';
      local_b40[7] = '\0';
      x = (char (*) [51])local_b40;
      amrex::DefaultFabFactory<amrex::FArrayBox>::DefaultFabFactory
                ((DefaultFabFactory<amrex::FArrayBox> *)in_stack_ffffffffffffe790);
      amrex::MultiFab::define
                ((MultiFab *)in_stack_ffffffffffffe7e0,(BoxArray *)in_stack_ffffffffffffe7d8,
                 (DistributionMapping *)in_stack_ffffffffffffe7d0,
                 (int)((ulong)in_stack_ffffffffffffe7c8 >> 0x20),(int)in_stack_ffffffffffffe7c8,
                 (MFInfo *)in_stack_ffffffffffffe7c0,
                 (FabFactory<amrex::FArrayBox> *)in_stack_ffffffffffffe7f0);
      amrex::DefaultFabFactory<amrex::FArrayBox>::~DefaultFabFactory
                ((DefaultFabFactory<amrex::FArrayBox> *)0x29b2ad);
      amrex::MFInfo::~MFInfo((MFInfo *)0x29b2ba);
      std::__cxx11::string::~string(local_b08);
      std::allocator<char>::~allocator((allocator<char> *)&local_b09);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_b60,"REACTIONS",&local_b61);
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>
      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>
                    *)in_stack_ffffffffffffe7d0,(key_type *)in_stack_ffffffffffffe7c8);
      std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::operator*
                ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
                 in_stack_ffffffffffffe790);
      amrex::Periodicity::NonPeriodic();
      amrex::FabArray<amrex::FArrayBox>::ParallelCopy
                ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffe7c0,
                 (FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffe7b8,
                 (Periodicity *)CONCAT44(in_stack_ffffffffffffe7b4,in_stack_ffffffffffffe7b0),
                 (CpOp)((ulong)in_stack_ffffffffffffe7a8 >> 0x20));
      std::__cxx11::string::~string(local_b60);
      std::allocator<char>::~allocator((allocator<char> *)&local_b61);
    }
    if (2 < NavierStokesBase::verbose) {
      amrex::OutStream();
      amrex::Print::Print(in_stack_ffffffffffffe7c0,(ostream *)in_stack_ffffffffffffe7b8);
      amrex::Print::operator<<((Print *)in_stack_ffffffffffffe790,x);
      local_d7c._136_4_ = amrex::FabArrayBase::size((FabArrayBase *)0x29b617);
      amrex::Print::operator<<((Print *)in_stack_ffffffffffffe790,(int *)x);
      local_d7c[0x87] = 10;
      amrex::Print::operator<<((Print *)in_stack_ffffffffffffe790,*x);
      amrex::Print::~Print((Print *)CONCAT44(in_stack_ffffffffffffe804,in_stack_ffffffffffffe800));
    }
    amrex::TilingIfNotGPU();
    amrex::MFIter::MFIter
              ((MFIter *)in_stack_ffffffffffffe7c0,&in_stack_ffffffffffffe7b8->super_FabArrayBase,
               SUB41((uint)in_stack_ffffffffffffe7b4 >> 0x18,0));
    while (bVar4 = amrex::MFIter::isValid((MFIter *)(local_d7c + 0x24)), bVar4) {
      amrex::MFIter::tilebox((MFIter *)in_stack_ffffffffffffe7f0);
      local_d7c._28_8_ = (element_type *)local_d7c;
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffe798,
                 (MFIter *)in_stack_ffffffffffffe790);
      local_dc8[8] = local_dc8;
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffe7a0,
                 (MFIter *)in_stack_ffffffffffffe798,(int)((ulong)in_stack_ffffffffffffe790 >> 0x20)
                );
      local_ea0._208_8_ = local_ea0 + 0x90;
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffe7a0,
                 (MFIter *)in_stack_ffffffffffffe798,(int)((ulong)in_stack_ffffffffffffe790 >> 0x20)
                );
      local_ea0._136_8_ = local_ea0 + 0x48;
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffe798,
                 (MFIter *)in_stack_ffffffffffffe790);
      local_ea0._64_8_ = (PeleLM *)local_ea0;
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffe798,
                 (MFIter *)in_stack_ffffffffffffe790);
      local_ea8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_f78 + 0x90);
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffe7a0,
                 (MFIter *)in_stack_ffffffffffffe798,(int)((ulong)in_stack_ffffffffffffe790 >> 0x20)
                );
      local_f78._136_8_ = (char (*) [51])(local_f78 + 0x48);
      amrex::FabArray<amrex::BaseFab<int>_>::array<amrex::BaseFab<int>,_0>
                (in_stack_ffffffffffffe798,(MFIter *)in_stack_ffffffffffffe790);
      local_1080._8_8_ = *(undefined8 *)local_dc8[8];
      local_1080._16_8_ = *(undefined8 *)(local_dc8[8] + 8);
      local_1080._24_8_ = *(Real *)(local_dc8[8] + 0x10);
      local_1080._32_8_ = *(Real *)(local_dc8[8] + 0x18);
      local_1080._40_8_ = *(Real *)(local_dc8[8] + 0x20);
      local_1080._60_8_ = *(undefined8 *)(local_dc8[8] + 0x34);
      local_1080._56_4_ = (undefined4)((ulong)*(undefined8 *)(local_dc8[8] + 0x2c) >> 0x20);
      local_1080._48_4_ = (undefined4)*(undefined8 *)(local_dc8[8] + 0x28);
      local_1080._52_4_ = (undefined4)((ulong)*(undefined8 *)(local_dc8[8] + 0x28) >> 0x20);
      local_1080._72_8_ = *(undefined8 *)local_ea0._208_8_;
      local_1080._80_8_ = *(Real *)(local_ea0._208_8_ + 8);
      local_1080._88_8_ = *(Real *)(local_ea0._208_8_ + 0x10);
      local_1080._96_8_ = *(Real *)(local_ea0._208_8_ + 0x18);
      RStack_1018 = *(Real *)(local_ea0._208_8_ + 0x20);
      uStack_1004 = *(undefined8 *)(local_ea0._208_8_ + 0x34);
      uStack_1008 = (undefined4)((ulong)*(undefined8 *)(local_ea0._208_8_ + 0x2c) >> 0x20);
      uStack_1010 = SUB84(*(Real *)(local_ea0._208_8_ + 0x28),0);
      local_100c = (undefined4)((ulong)*(Real *)(local_ea0._208_8_ + 0x28) >> 0x20);
      local_ff8 = (local_ea8._M_pi)->_vptr__Sp_counted_base;
      RStack_ff0 = *(Real *)&(local_ea8._M_pi)->_M_use_count;
      local_fe8 = local_ea8._M_pi[1]._vptr__Sp_counted_base;
      dStack_fe0 = *(double *)&local_ea8._M_pi[1]._M_use_count;
      pp_Stack_fd8 = local_ea8._M_pi[2]._vptr__Sp_counted_base;
      uVar1 = local_ea8._M_pi[2]._M_use_count;
      uVar2 = local_ea8._M_pi[2]._M_weak_count;
      aiStack_fc4._0_8_ = *(undefined8 *)((long)&local_ea8._M_pi[3]._vptr__Sp_counted_base + 4);
      fStack_fc8 = (float)((ulong)*(undefined8 *)&local_ea8._M_pi[2]._M_weak_count >> 0x20);
      local_fb8 = *(pointer *)local_f78._136_8_;
      piStack_fb0 = *(pointer *)(local_f78._136_8_ + 8);
      local_fa8 = *(pointer *)(local_f78._136_8_ + 0x10);
      uStack_fa0 = *(undefined8 *)(local_f78._136_8_ + 0x18);
      uStack_f98 = *(undefined8 *)(local_f78._136_8_ + 0x20);
      uStack_f84 = *(undefined8 *)(local_f78._136_8_ + 0x34);
      uStack_f88 = (undefined4)((ulong)*(undefined8 *)(local_f78._136_8_ + 0x2c) >> 0x20);
      uStack_f90 = SUB84(*(pointer *)(local_f78._136_8_ + 0x28),0);
      local_f8c = (undefined4)((ulong)*(pointer *)(local_f78._136_8_ + 0x28) >> 0x20);
      fStack_fd0 = (float)uVar1;
      local_fcc = (float)uVar2;
      local_f78._64_8_ = (FabArray<amrex::BaseFab<int>_> *)local_f78;
      amrex::
      ParallelFor<PeleLM::advance_chemistry(amrex::MultiFab&,amrex::MultiFab&,double,amrex::MultiFab_const&)::__0>
                (in_stack_ffffffffffffe7e0,in_stack_ffffffffffffe7d8);
      local_1080._0_8_ = local_a8._M_pi;
      local_1088 = 0;
      pRVar9 = std::
               unique_ptr<pele::physics::reactions::ReactorBase,_std::default_delete<pele::physics::reactions::ReactorBase>_>
               ::operator->((unique_ptr<pele::physics::reactions::ReactorBase,_std::default_delete<pele::physics::reactions::ReactorBase>_>
                             *)0x29b9c0);
      in_stack_ffffffffffffe7a8 = &local_1088;
      in_stack_ffffffffffffe7a0 = (NavierStokesBase *)local_1080;
      x = (char (*) [51])local_f78._136_8_;
      in_stack_ffffffffffffe790 = (PeleLM *)local_ea0._64_8_;
      in_stack_ffffffffffffe798 = (FabArray<amrex::BaseFab<int>_> *)local_f78._64_8_;
      (*(pRVar9->super_Factory<pele::physics::reactions::ReactorBase>)._vptr_Factory[5])
                (pRVar9,local_d7c._28_8_,local_dc8[8],local_ea8._M_pi,local_ea0._136_8_,
                 local_ea0._208_8_,local_f78._136_8_);
      local_1080._0_8_ = local_a8._M_pi;
      local_1088 = 0;
      memcpy(local_1108,(void *)local_dc8[8],0x3c);
      memcpy(auStack_10c8,(void *)local_ea0._208_8_,0x3c);
      amrex::
      ParallelFor<PeleLM::advance_chemistry(amrex::MultiFab&,amrex::MultiFab&,double,amrex::MultiFab_const&)::__1>
                (in_stack_ffffffffffffe7e0,(anon_class_128_2_05bb5c94 *)in_stack_ffffffffffffe7d8);
      amrex::MFIter::operator++((MFIter *)(local_d7c + 0x24));
    }
    amrex::MFIter::~MFIter((MFIter *)in_stack_ffffffffffffe790);
    amrex::FabArray<amrex::FArrayBox>::clear
              ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffe7d0);
    amrex::Periodicity::NonPeriodic();
    uVar11 = (ulong)x & 0xffffffff00000000;
    amrex::FabArray<amrex::FArrayBox>::ParallelCopy
              ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffe7c0,
               (FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffe7b8,in_stack_ffffffffffffe7b4,
               in_stack_ffffffffffffe7b0,(int)((ulong)in_stack_ffffffffffffe7a8 >> 0x20),
               (Periodicity *)in_stack_ffffffffffffe7a0,(CpOp)in_stack_ffffffffffffe7d0);
    amrex::FabArray<amrex::FArrayBox>::clear
              ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffe7d0);
    amrex::TilingIfNotGPU();
    amrex::MFIter::MFIter
              ((MFIter *)in_stack_ffffffffffffe7c0,&in_stack_ffffffffffffe7b8->super_FabArrayBase,
               SUB41((uint)in_stack_ffffffffffffe7b4 >> 0x18,0));
    while( true ) {
      bVar4 = amrex::MFIter::isValid(&local_1168);
      iVar12 = (int)(uVar11 >> 0x20);
      iVar5 = (int)in_stack_ffffffffffffe810;
      if (!bVar4) break;
      amrex::MFIter::tilebox((MFIter *)in_stack_ffffffffffffe7f0);
      local_1170 = local_118c;
      amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffe7a0,
                 (MFIter *)in_stack_ffffffffffffe798,(int)((ulong)in_stack_ffffffffffffe790 >> 0x20)
                );
      local_1198 = local_11d8;
      amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffe7a0,
                 (MFIter *)in_stack_ffffffffffffe798,(int)((ulong)in_stack_ffffffffffffe790 >> 0x20)
                );
      local_11e0 = local_1220;
      amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffe798,
                 (MFIter *)in_stack_ffffffffffffe790);
      local_1228 = local_1268;
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffe798,
                 (MFIter *)in_stack_ffffffffffffe790);
      local_1270 = local_12b0;
      local_12b8 = 1.0 / (double)local_a8._M_pi;
      memcpy(local_13c0,local_1198,0x3c);
      memcpy(auStack_1380,local_11e0,0x3c);
      memcpy(auStack_1340,local_1228,0x3c);
      memcpy(auStack_1300,local_1270,0x3c);
      local_12c0 = local_12b8;
      amrex::
      ParallelFor<int,PeleLM::advance_chemistry(amrex::MultiFab&,amrex::MultiFab&,double,amrex::MultiFab_const&)::__2,void>
                (in_stack_ffffffffffffe7e0,(int)((ulong)in_stack_ffffffffffffe7d8 >> 0x20),
                 (anon_class_264_5_13b85254 *)in_stack_ffffffffffffe7d0);
      amrex::MFIter::operator++(&local_1168);
    }
    amrex::MFIter::~MFIter((MFIter *)in_stack_ffffffffffffe790);
    if ((local_a51 & 1) != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_13e0,"REACTIONS",&local_13e1);
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>
      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>
                    *)in_stack_ffffffffffffe7d0,(key_type *)in_stack_ffffffffffffe7c8);
      std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::operator->
                ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)0x29bdf7);
      amrex::Periodicity::NonPeriodic();
      amrex::FabArray<amrex::FArrayBox>::ParallelCopy
                ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffe7c0,
                 (FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffe7b8,
                 (Periodicity *)CONCAT44(in_stack_ffffffffffffe7b4,in_stack_ffffffffffffe7b0),
                 (CpOp)((ulong)in_stack_ffffffffffffe7a8 >> 0x20));
      std::__cxx11::string::~string(local_13e0);
      std::allocator<char>::~allocator((allocator<char> *)&local_13e1);
      amrex::FabArray<amrex::FArrayBox>::clear
                ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffe7d0);
    }
    pFVar8 = (FabArrayBase *)
             amrex::AmrLevel::get_new_data((AmrLevel *)in_stack_ffffffffffffe790,iVar12);
    local_13f0 = pFVar8;
    local_13f4 = amrex::FabArrayBase::nGrow(pFVar8,0);
    op = (CpOp)pFVar8;
    piVar6 = std::min<int>(local_144,&local_13f4);
    iVar13 = *piVar6;
    in_stack_ffffffffffffe790 = (PeleLM *)amrex::Periodicity::NonPeriodic();
    in_stack_ffffffffffffe788 = (BoxArray *)CONCAT44(iVar12,iVar13);
    S_fine = (MultiFab *)((ulong)in_stack_ffffffffffffe798 & 0xffffffff00000000);
    amrex::FabArray<amrex::FArrayBox>::ParallelCopy
              (in_stack_ffffffffffffe7f8,in_stack_ffffffffffffe7f0,
               (int)((ulong)in_stack_ffffffffffffe7e8 >> 0x20),(int)in_stack_ffffffffffffe7e8,
               (int)((ulong)in_stack_ffffffffffffe7e0 >> 0x20),(int)in_stack_ffffffffffffe7e0,iVar5,
               (Periodicity *)CONCAT44(iVar13,in_stack_ffffffffffffe818),op);
    amrex::FabArray<amrex::FArrayBox>::clear
              ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffe7d0);
    if ((local_144[0x22]._3_1_ & 1) != 0) {
      getLevel(in_stack_ffffffffffffe790,(int)((ulong)in_stack_ffffffffffffe788 >> 0x20));
      local_1400 = amrex::AmrLevel::get_old_data
                             ((AmrLevel *)in_stack_ffffffffffffe790,
                              (int)((ulong)in_stack_ffffffffffffe788 >> 0x20));
      NavierStokesBase::average_down
                (in_stack_ffffffffffffe7a0,S_fine,(MultiFab *)in_stack_ffffffffffffe790,
                 (int)((ulong)in_stack_ffffffffffffe788 >> 0x20),(int)in_stack_ffffffffffffe788);
    }
    cross = (undefined1)((ulong)S_fine >> 0x38);
    if (0 < local_144[0]) {
      PVar10 = amrex::Geometry::periodicity((Geometry *)in_stack_ffffffffffffe7c0);
      local_1420.vect[2] = PVar10.period.vect[2];
      local_1408 = local_1420.vect[2];
      local_1420.vect._0_8_ = PVar10.period.vect._0_8_;
      local_1410._0_4_ = local_1420.vect[0];
      local_1410._4_4_ = local_1420.vect[1];
      local_1420 = PVar10.period.vect;
      amrex::FabArray<amrex::FArrayBox>::FillBoundary<double>
                ((FabArray<amrex::FArrayBox> *)
                 CONCAT44(in_stack_ffffffffffffe7b4,in_stack_ffffffffffffe7b0),
                 (int)((ulong)in_stack_ffffffffffffe7a8 >> 0x20),(int)in_stack_ffffffffffffe7a8,
                 (Periodicity *)in_stack_ffffffffffffe7a0,(bool)cross);
      in_stack_ffffffffffffe804 = 0;
      amrex::FabArrayBase::nGrow((FabArrayBase *)local_144._4_8_,0);
      amrex::Extrapolater::FirstOrderExtrap
                (in_stack_ffffffffffffeb20,in_stack_ffffffffffffeb18,in_stack_ffffffffffffeb14,
                 in_stack_ffffffffffffeb10,in_stack_ffffffffffffeb0c);
    }
    amrex::FabArray<amrex::BaseFab<int>_>::~FabArray
              ((FabArray<amrex::BaseFab<int>_> *)in_stack_ffffffffffffe790);
    amrex::MultiFab::~MultiFab((MultiFab *)0x29c09b);
    amrex::MultiFab::~MultiFab((MultiFab *)0x29c0a8);
    amrex::MultiFab::~MultiFab((MultiFab *)0x29c0b5);
    amrex::MultiFab::~MultiFab((MultiFab *)0x29c0c2);
    amrex::DistributionMapping::~DistributionMapping((DistributionMapping *)0x29c0cf);
    amrex::BoxArray::~BoxArray((BoxArray *)in_stack_ffffffffffffe790);
    amrex::BoxArray::~BoxArray((BoxArray *)in_stack_ffffffffffffe790);
  }
  else {
    amrex::MultiFab::Copy
              ((MultiFab *)in_stack_ffffffffffffe7c0,(MultiFab *)in_stack_ffffffffffffe7b8,
               in_stack_ffffffffffffe7b4,in_stack_ffffffffffffe7b0,
               (int)((ulong)in_stack_ffffffffffffe7a8 >> 0x20),(int)in_stack_ffffffffffffe7a8);
    amrex::MultiFab::Saxpy
              ((MultiFab *)in_stack_ffffffffffffe7d0,(Real)in_stack_ffffffffffffe7c8,
               (MultiFab *)in_stack_ffffffffffffe7c0,(int)((ulong)in_stack_ffffffffffffe7b8 >> 0x20)
               ,(int)in_stack_ffffffffffffe7b8,in_stack_ffffffffffffe7b4,in_stack_ffffffffffffe7b0);
    amrex::AmrLevel::get_new_data
              ((AmrLevel *)in_stack_ffffffffffffe790,(int)((ulong)in_stack_ffffffffffffe788 >> 0x20)
              );
    amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
              ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffe790,
               (value_type)in_stack_ffffffffffffe788);
    amrex::AmrLevel::get_new_data
              ((AmrLevel *)in_stack_ffffffffffffe790,(int)((ulong)in_stack_ffffffffffffe788 >> 0x20)
              );
    amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
              ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffe790,
               (value_type)in_stack_ffffffffffffe788);
  }
  if (2 < NavierStokesBase::verbose) {
    local_1424 = amrex::ParallelDescriptor::IOProcessorNumber();
    local_1438 = amrex::ParallelDescriptor::second();
    local_1438 = local_1438 - (double)local_144._140_8_;
    local_1430 = local_1438;
    amrex::ParallelDescriptor::ReduceRealMin<double>(&local_1438,local_1424);
    amrex::ParallelDescriptor::ReduceRealMax<double>(&local_1430,local_1424);
    amrex::OutStream();
    amrex::Print::Print(in_stack_ffffffffffffe7c0,(ostream *)in_stack_ffffffffffffe7b8);
    amrex::Print::operator<<
              ((Print *)in_stack_ffffffffffffe790,(char (*) [41])in_stack_ffffffffffffe788);
    amrex::Print::operator<<((Print *)in_stack_ffffffffffffe790,(int *)in_stack_ffffffffffffe788);
    amrex::Print::operator<<
              ((Print *)in_stack_ffffffffffffe790,(char (*) [10])in_stack_ffffffffffffe788);
    amrex::Print::operator<<((Print *)in_stack_ffffffffffffe790,(double *)in_stack_ffffffffffffe788)
    ;
    amrex::Print::operator<<
              ((Print *)in_stack_ffffffffffffe790,(char (*) [6])in_stack_ffffffffffffe788);
    amrex::Print::operator<<((Print *)in_stack_ffffffffffffe790,(double *)in_stack_ffffffffffffe788)
    ;
    amrex::Print::operator<<
              ((Print *)in_stack_ffffffffffffe790,(char (*) [3])in_stack_ffffffffffffe788);
    amrex::Print::~Print((Print *)CONCAT44(in_stack_ffffffffffffe804,in_stack_ffffffffffffe800));
  }
  return;
}

Assistant:

void
PeleLM::advance_chemistry (MultiFab&       mf_old,
                           MultiFab&       mf_new,
                           Real            dt,
                           const MultiFab& Force)
{
  BL_PROFILE("PLM::advance_chemistry()");

  const Real strt_time = ParallelDescriptor::second();

  const bool do_avg_down_chem = avg_down_chem
    && level < parent->finestLevel()
    && getLevel(level+1).state[RhoYdot_Type].hasOldData();

  if (hack_nochem)
  {
    MultiFab::Copy(mf_new,mf_old,first_spec,first_spec,NUM_SPECIES+2,0);
    MultiFab::Saxpy(mf_new,dt,Force,0,first_spec,NUM_SPECIES+1,0);
    get_new_data(RhoYdot_Type).setVal(0);
    get_new_data(FuncCount_Type).setVal(0);
  }
  else
  {
    BoxArray cf_grids;

    if (do_avg_down_chem)
    {
      cf_grids = getLevel(level+1).boxArray(); cf_grids.coarsen(fine_ratio);
    }

    MultiFab&  React_new = get_new_data(RhoYdot_Type);
    const int  ngrow     = std::min(std::min(React_new.nGrow(),mf_old.nGrow()),mf_new.nGrow());

    BoxArray  ba           = mf_new.boxArray();
    DistributionMapping dm = mf_new.DistributionMap();
#ifndef AMREX_USE_GPU
    //
    // Chop the grids to level out the chemistry work when on the CPU.
    // We want enough grids so that KNAPSACK works well,
    // but not too many to make unweildy BoxArrays.
    //
    const int Threshold = chem_box_chop_threshold * ParallelDescriptor::NProcs();
    bool      done      = (ba.size() >= Threshold);

    for (int cnt = 1; !done; cnt *= 2)
    {
      const IntVect ChunkSize = parent->maxGridSize(level)/cnt;

      if ( AMREX_D_TERM(ChunkSize[0] < 16, || ChunkSize[1] < 16, || ChunkSize[2] < 16) )
        //
        // Don't let grids get too small.
        //
        break;

      IntVect chunk(ChunkSize);

      for (int j = AMREX_SPACEDIM-1; j >=0 && ba.size() < Threshold; j--)
      {
        chunk[j] /= 2;
        ba.maxSize(chunk);
        if (ba.size() >= Threshold) done = true;
      }
    }

    dm = getFuncCountDM(ba,ngrow);
#endif

    MultiFab STemp(ba, dm, NUM_SPECIES+3, 0);
    MultiFab FTemp(ba, dm, Force.nComp(), 0);

    STemp.ParallelCopy(mf_old,first_spec,0,NUM_SPECIES+3); // Parallel copy.
    FTemp.ParallelCopy(Force);                          // Parallel copy.

    MultiFab fcnCntTemp(ba, dm, 1, 0);
    MultiFab diagTemp;

    // Setup a mask for chemistry. Right used only for EB.
    // TODO: find a way to set that up properly when running boxes on GPU.
    amrex::FabArray<amrex::BaseFab<int>>  react_mask;
    react_mask.define(ba, dm,  1, 0);
#ifdef AMREX_USE_EB
    react_mask.ParallelCopy(ebmask);
#else
    react_mask.setVal(1);
#endif

    const bool do_diag = plot_reactions && amrex::intersect(ba,auxDiag["REACTIONS"]->boxArray()).size() != 0;

    if (do_diag)
    {
        diagTemp.define(ba, dm, auxDiag["REACTIONS"]->nComp(), 0);
        diagTemp.ParallelCopy(*auxDiag["REACTIONS"]); // Parallel copy
    }

    if (verbose > 2)
      amrex::Print() << "      PeleLM::advance_chemistry() FABs in tmp MF: " << STemp.size() << '\n';

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter Smfi(STemp,amrex::TilingIfNotGPU()); Smfi.isValid(); ++Smfi)
    {
        const Box& bx       = Smfi.tilebox();
        auto const& rhoY     = STemp.array(Smfi);
        auto const& rhoH     = STemp.array(Smfi,NUM_SPECIES);
        auto const& temp     = STemp.array(Smfi,NUM_SPECIES+1);
        auto const& fcl      = fcnCntTemp.array(Smfi);
        auto const& frc_rhoY = FTemp.array(Smfi);
        auto const& frc_rhoH = FTemp.array(Smfi, NUM_SPECIES);
        auto const& mask     = react_mask.array(Smfi);

        // Convert MKS -> CGS
        ParallelFor(bx, [rhoY,rhoH, frc_rhoY, frc_rhoH]
        AMREX_GPU_DEVICE (int i, int j, int k) noexcept
        {
           for (int n = 0; n < NUM_SPECIES; n++) {
              rhoY(i,j,k,n) *= 1.0e-3;
              frc_rhoY(i,j,k,n) *= 1.0e-3;
           }
           rhoH(i,j,k) *= 10.0;
           frc_rhoH(i,j,k) *= 10.0;
        });

        BL_PROFILE_VAR("React()", ReactInLoop);
        Real dt_incr     = dt;
        Real time_chem   = 0;
        /* Solve */
        m_reactor->react(bx, rhoY, frc_rhoY, temp,
                         rhoH, frc_rhoH, fcl,
                         mask, dt_incr, time_chem
#ifdef AMREX_USE_GPU
                         , amrex::Gpu::gpuStream()
#endif
                         );
        dt_incr   = dt;
        time_chem = 0;
        BL_PROFILE_VAR_STOP(ReactInLoop);

        // Convert CGS -> MKS
        ParallelFor(bx, [rhoY,rhoH]
        AMREX_GPU_DEVICE (int i, int j, int k) noexcept
        {
           for (int n = 0; n < NUM_SPECIES; n++) {
              rhoY(i,j,k,n) *= 1.0e3;
           }
           rhoH(i,j,k) *= 0.1;
        });

#ifdef AMREX_USE_GPU
        Gpu::Device::streamSynchronize();
#endif
    }

    FTemp.clear();

    mf_new.ParallelCopy(STemp,0,first_spec,NUM_SPECIES+3); // Parallel copy.

    STemp.clear();

    //
    // Set React_new (I_R).
    //
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(mf_old,amrex::TilingIfNotGPU()); mfi.isValid(); ++mfi)
    {
        const Box& bx         = mfi.tilebox();
        auto const& rhoY_o    = mf_old.const_array(mfi,first_spec);
        auto const& rhoY_n    = mf_new.const_array(mfi,first_spec);
        auto const& frc_rhoY  = Force.const_array(mfi);
        auto const& rhoYdot   = React_new.array(mfi);
        Real dt_inv = 1.0/dt;
        ParallelFor(bx, NUM_SPECIES, [rhoY_o, rhoY_n, frc_rhoY, rhoYdot, dt_inv]
        AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
        {
           rhoYdot(i,j,k,n) = - ( rhoY_o(i,j,k,n) - rhoY_n(i,j,k,n) ) * dt_inv - frc_rhoY(i,j,k,n);
        });
    }

    if (do_diag)
    {
      auxDiag["REACTIONS"]->ParallelCopy(diagTemp); // Parallel copy
      diagTemp.clear();
    }

    MultiFab& FC = get_new_data(FuncCount_Type);
    FC.ParallelCopy(fcnCntTemp,0,0,1,0,std::min(ngrow,FC.nGrow()));
    fcnCntTemp.clear();
    //
    // Approximate covered crse chemistry (I_R) with averaged down fine I_R from previous time step.
    //
    if (do_avg_down_chem)
    {
      MultiFab& fine_React = getLevel(level+1).get_old_data(RhoYdot_Type);
      average_down(fine_React, React_new, 0, NUM_SPECIES);
    }
    //
    // Ensure consistent grow cells.
    //
    if (ngrow > 0)
    {
      React_new.FillBoundary(0,NUM_SPECIES, geom.periodicity());
      Extrapolater::FirstOrderExtrap(React_new, geom, 0, NUM_SPECIES, React_new.nGrow());
    }
  }

  if (verbose > 2)
  {
    const int IOProc = ParallelDescriptor::IOProcessorNumber();

    Real mx = ParallelDescriptor::second() - strt_time, mn = mx;

    ParallelDescriptor::ReduceRealMin(mn,IOProc);
    ParallelDescriptor::ReduceRealMax(mx,IOProc);

    amrex::Print() << "      PeleLM::advance_chemistry(): lev: " << level << ", time: ["
                   << mn << " ... " << mx << "]\n";
  }
}